

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

int poisson_sample(double a,int *seed)

{
  ostream *poVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (a <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"POISSON_SAMPLE - Fatal error!\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  A <= 0.\n",10);
    iVar2 = 0;
  }
  else {
    dVar3 = uniform_01_sample(seed);
    iVar2 = 0;
    dVar4 = -a;
    dVar6 = 0.0;
    do {
      if (iVar2 == 0) {
        dVar4 = exp(-a);
        dVar5 = dVar4;
      }
      else {
        dVar4 = (dVar4 * a) / (double)iVar2;
        dVar5 = dVar6 + dVar4;
      }
      if ((dVar6 <= dVar3) && (dVar3 <= dVar5)) {
        return iVar2;
      }
      iVar2 = iVar2 + 1;
      dVar6 = dVar5;
    } while (iVar2 != 0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"POISSON_SAMPLE - Warning!\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Exceeded KMAX = ",0x12);
    iVar2 = 100;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  }
  return iVar2;
}

Assistant:

int poisson_sample ( double a, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    POISSON_SAMPLE samples the Poisson PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 February 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, the parameter of the PDF.
//    0 < A.
//
//    Input/output, int &SEED, the random number generator seed.
//
//    Output, int POISSON_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  int i;
  int KMAX = 100;
  double last;
  double next;
  double sum;
  double sumold;
//
//  Check.
//
  if ( a <= 0.0 )
  {
    cerr << "\n";
    cerr << "POISSON_SAMPLE - Fatal error!\n";
    cerr << "  A <= 0.\n";
    return 0;
  }
//
//  Pick a random value of CDF.
//
  cdf = uniform_01_sample ( seed );
//
//  Now simply start at K = 0, and find the first value for which
//  CDF(K-1) <= CDF <= CDF(K).
//
  sum = 0.0;

  for ( i = 0; i <= KMAX; i++ )
  {
    sumold = sum;

    if ( i == 0 )
    {
      next = exp ( -a );
      sum = next;
    }
    else
    {
      last = next;
      next = last * a / static_cast< double > ( i);
      sum = sum + next;
    }

    if ( sumold <= cdf && cdf <= sum )
    {
      return i;
    }

  }

  cout << "\n";
  cout << "POISSON_SAMPLE - Warning!\n";
  cout << "  Exceeded KMAX = " << KMAX << "\n";

  return KMAX;
}